

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O1

void __thiscall QMdiSubWindow::~QMdiSubWindow(QMdiSubWindow *this)

{
  undefined1 *this_00;
  
  this_00 = &this[-1].super_QWidget.field_0x18;
  ~QMdiSubWindow((QMdiSubWindow *)this_00);
  operator_delete(this_00,0x28);
  return;
}

Assistant:

QMdiSubWindow::~QMdiSubWindow()
{
    Q_D(QMdiSubWindow);
#if QT_CONFIG(menubar)
    d->removeButtonsFromMenuBar();
#endif
    d->setActive(false);
    delete d->controlContainer;
}